

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::TrackAllocCore
          (Recycler *this,void *object,size_t size,TrackAllocData *trackAllocData,bool traceLifetime
          )

{
  long *plVar1;
  int *piVar2;
  ulong uVar3;
  code *pcVar4;
  bool bVar5;
  TrackerData *pTVar6;
  undefined4 *puVar7;
  long lVar8;
  char16_t *form;
  ulong uVar9;
  ulong uVar10;
  type_info *local_40;
  TrackerItem *local_38;
  TrackerItem *item;
  
  local_40 = trackAllocData->typeinfo;
  if (DAT_015d6421 == '\x01') {
    TrackFree(this,(char *)object,size);
  }
  pTVar6 = GetTrackerData(this,object);
  if (pTVar6 != (TrackerData *)0x0) {
    pTVar6 = GetTrackerData(this,object);
    if (pTVar6 != &TrackerData::ExplicitFreeListObjectData) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1ffb,
                         "(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData)"
                         ,
                         "GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData"
                        );
      if (!bVar5) goto LAB_0072277e;
      *puVar7 = 0;
    }
  }
  if (local_40 == (type_info *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1ffc,"(typeInfo != nullptr)","typeInfo != nullptr");
    if (!bVar5) goto LAB_0072277e;
    *puVar7 = 0;
  }
  uVar3 = trackAllocData->count;
  uVar9 = size - trackAllocData->plusSize;
  if (uVar3 == 0xffffffffffffffff) {
    uVar10 = 1;
  }
  else {
    uVar9 = uVar9 / uVar3;
    uVar10 = uVar3;
  }
  bVar5 = JsUtil::
          BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<std::type_info_const*>
                    ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->trackerDictionary,&local_40,&local_38);
  if (bVar5) {
    if ((local_38->instanceData).typeinfo != local_40) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2021,"(item->instanceData.typeinfo == typeInfo)",
                         "item->instanceData.typeinfo == typeInfo");
      if (!bVar5) goto LAB_0072277e;
      *puVar7 = 0;
    }
    if ((local_38->instanceData).ItemSize != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2022,"(item->instanceData.ItemSize == itemSize)",
                         "item->instanceData.ItemSize == itemSize");
      if (!bVar5) goto LAB_0072277e;
      *puVar7 = 0;
    }
    if ((local_38->arrayData).ItemSize != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2023,"(item->arrayData.ItemSize == itemSize)",
                         "item->arrayData.ItemSize == itemSize");
      if (!bVar5) {
LAB_0072277e:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
  }
  else {
    if ((uVar3 == 0xffffffffffffffff) || (DAT_015d6421 == '\0')) {
      local_38 = (TrackerItem *)
                 NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x90);
      (local_38->instanceData).typeinfo = local_40;
      (local_38->instanceData).isArray = false;
      (local_38->instanceData).TraceLifetime = false;
      (local_38->instanceData).FreeSize = 0;
      (local_38->instanceData).AllocCount = 0;
      (local_38->instanceData).ItemSize = 0;
      (local_38->instanceData).ItemCount = 0;
      (local_38->instanceData).FreeCount = 0;
      (local_38->instanceData).ReqSize = 0;
      (local_38->instanceData).AllocSize = 0;
      (local_38->arrayData).typeinfo = local_40;
      (local_38->arrayData).isArray = true;
      (local_38->arrayData).TraceLifetime = false;
      (local_38->arrayData).FreeSize = 0;
      (local_38->arrayData).AllocCount = 0;
      (local_38->arrayData).ItemSize = 0;
      (local_38->arrayData).ItemCount = 0;
      (local_38->arrayData).FreeCount = 0;
      (local_38->arrayData).ReqSize = 0;
      (local_38->arrayData).AllocSize = 0;
    }
    else {
      local_38 = (TrackerItem *)
                 NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x110);
      (local_38->instanceData).typeinfo = local_40;
      (local_38->instanceData).isArray = false;
      (local_38->instanceData).TraceLifetime = false;
      (local_38->instanceData).FreeSize = 0;
      (local_38->instanceData).AllocCount = 0;
      (local_38->instanceData).ItemSize = 0;
      (local_38->instanceData).ItemCount = 0;
      (local_38->instanceData).FreeCount = 0;
      (local_38->instanceData).ReqSize = 0;
      (local_38->instanceData).AllocSize = 0;
      (local_38->arrayData).typeinfo = local_40;
      (local_38->arrayData).isArray = true;
      (local_38->arrayData).TraceLifetime = false;
      (local_38->arrayData).FreeSize = 0;
      (local_38->arrayData).AllocCount = 0;
      (local_38->arrayData).ItemSize = 0;
      (local_38->arrayData).ItemCount = 0;
      (local_38->arrayData).FreeCount = 0;
      (local_38->arrayData).ReqSize = 0;
      (local_38->arrayData).AllocSize = 0;
      StackBackTrace::Capture((char *)(local_38 + 1),0x80,7);
    }
    (local_38->instanceData).ItemSize = uVar9;
    (local_38->arrayData).ItemSize = uVar9;
    JsUtil::
    BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->trackerDictionary,&local_40,&local_38);
  }
  lVar8 = 0x48;
  if (uVar3 == 0xffffffffffffffff) {
    lVar8 = 0;
  }
  plVar1 = (long *)((long)&(local_38->instanceData).ItemCount + lVar8);
  *plVar1 = *plVar1 + uVar10;
  piVar2 = (int *)((long)&(local_38->instanceData).AllocCount + lVar8);
  *piVar2 = *piVar2 + 1;
  plVar1 = (long *)((long)&(local_38->instanceData).ReqSize + lVar8);
  *plVar1 = *plVar1 + size;
  plVar1 = (long *)((long)&(local_38->instanceData).AllocSize + lVar8);
  *plVar1 = *plVar1 + (size + 0xf & 0xfffffffffffffff0);
  pTVar6 = (TrackerData *)((long)&(local_38->instanceData).typeinfo + lVar8);
  (&(local_38->instanceData).TraceLifetime)[lVar8] = traceLifetime;
  if (traceLifetime) {
    form = L"Allocated %S %p\n";
    if (pTVar6->isArray != false) {
      form = L"Allocated %S[] %p\n";
    }
    Output::Print(form,*(char **)(pTVar6->typeinfo + 8) + (**(char **)(pTVar6->typeinfo + 8) == '*')
                  ,object);
  }
  SetTrackerData(this,object,pTVar6);
  return;
}

Assistant:

void
Recycler::TrackAllocCore(void * object, size_t size, const TrackAllocData& trackAllocData, bool traceLifetime)
{
    auto&& typeInfo = trackAllocData.GetTypeInfo();
    if (CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree((char*)object, size);
    }

    Assert(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData);
    Assert(typeInfo != nullptr);
    TrackerItem * item;
    size_t allocCount = trackAllocData.GetCount();
    size_t itemSize = (size - trackAllocData.GetPlusSize());
    bool isArray;
    if (allocCount != (size_t)-1)
    {
        isArray = true;
        itemSize = itemSize / allocCount;
    }
    else
    {
        isArray = false;
        allocCount = 1;
    }

    if (!trackerDictionary->TryGetValue(typeInfo, &item))
    {
#ifdef STACK_BACK_TRACE
        if (CONFIG_FLAG(KeepRecyclerTrackData) && isArray) // type info is not useful record stack instead
        {
            size_t stackTraceSize = 16 * sizeof(void*);
            item = NoCheckHeapNewPlus(stackTraceSize, TrackerItem, typeInfo);
            StackBackTrace::Capture((char*)&item[1], stackTraceSize, 7);
        }
        else
#endif
        {
            item = NoCheckHeapNew(TrackerItem, typeInfo);
        }

        item->instanceData.ItemSize = itemSize;
        item->arrayData.ItemSize = itemSize;
        trackerDictionary->Item(typeInfo, item);
    }
    else
    {
        Assert(item->instanceData.typeinfo == typeInfo);
        Assert(item->instanceData.ItemSize == itemSize);
        Assert(item->arrayData.ItemSize == itemSize);
    }
    TrackerData& data = (isArray)? item->arrayData : item->instanceData;
        data.ItemCount += allocCount;
        data.AllocCount++;
        data.ReqSize += size;
        data.AllocSize += HeapInfo::GetAlignedSizeNoCheck(size);
#ifdef TRACE_OBJECT_LIFETIME
    data.TraceLifetime = traceLifetime;

    if (traceLifetime)
    {
        Output::Print(data.isArray ? _u("Allocated %S[] %p\n") : _u("Allocated %S %p\n"), data.typeinfo->name(), object);
    }
#endif
#ifdef PERF_COUNTERS
    ++data.counter;
    data.sizeCounter += HeapInfo::GetAlignedSizeNoCheck(size);
#endif

    SetTrackerData(object, &data);
}